

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  undefined4 uVar10;
  ulong uVar11;
  long lVar12;
  NodeRef *pNVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  Primitive *prim;
  ulong unaff_R13;
  size_t mask;
  int iVar19;
  bool bVar20;
  undefined8 uVar21;
  undefined1 auVar22 [32];
  uint uVar23;
  uint uVar26;
  undefined1 auVar24 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  Precalculations pre;
  NodeRef stack [564];
  undefined1 auVar25 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      pNVar13 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx((undefined1  [16])aVar2,auVar24);
      auVar28._8_4_ = 0x219392ef;
      auVar28._0_8_ = 0x219392ef219392ef;
      auVar28._12_4_ = 0x219392ef;
      auVar24 = vcmpps_avx(auVar24,auVar28,1);
      auVar24 = vblendvps_avx((undefined1  [16])aVar2,auVar28,auVar24);
      auVar28 = vrcpps_avx(auVar24);
      auVar29._8_4_ = 0x3f800000;
      auVar29._0_8_ = &DAT_3f8000003f800000;
      auVar29._12_4_ = 0x3f800000;
      auVar24 = vfnmadd231ps_fma(auVar29,auVar28,auVar24);
      auVar8 = vfmadd132ps_fma(auVar24,auVar28,auVar28);
      fVar27 = auVar8._0_4_;
      auVar34._4_4_ = fVar27;
      auVar34._0_4_ = fVar27;
      auVar34._8_4_ = fVar27;
      auVar34._12_4_ = fVar27;
      auVar34._16_4_ = fVar27;
      auVar34._20_4_ = fVar27;
      auVar34._24_4_ = fVar27;
      auVar34._28_4_ = fVar27;
      auVar24 = vmovshdup_avx(auVar8);
      uVar21 = auVar24._0_8_;
      auVar35._8_8_ = uVar21;
      auVar35._0_8_ = uVar21;
      auVar35._16_8_ = uVar21;
      auVar35._24_8_ = uVar21;
      auVar29 = vshufpd_avx(auVar8,auVar8,1);
      auVar28 = vshufps_avx(auVar8,auVar8,0xaa);
      uVar21 = auVar28._0_8_;
      auVar36._8_8_ = uVar21;
      auVar36._0_8_ = uVar21;
      auVar36._16_8_ = uVar21;
      auVar36._24_8_ = uVar21;
      auVar30._0_4_ = fVar27 * (ray->org).field_0.m128[0];
      auVar30._4_4_ = auVar8._4_4_ * (ray->org).field_0.m128[1];
      auVar30._8_4_ = auVar8._8_4_ * (ray->org).field_0.m128[2];
      auVar30._12_4_ = auVar8._12_4_ * (ray->org).field_0.m128[3];
      auVar28 = vmovshdup_avx(auVar30);
      auVar8 = vshufps_avx(auVar30,auVar30,0xaa);
      uVar14 = (ulong)(fVar27 < 0.0) * 0x20;
      uVar15 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x40;
      uVar16 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x80;
      uVar11 = CONCAT44(auVar30._0_4_,auVar30._0_4_);
      auVar22._0_8_ = uVar11 ^ 0x8000000080000000;
      auVar22._8_4_ = -auVar30._0_4_;
      auVar22._12_4_ = -auVar30._0_4_;
      auVar22._16_4_ = -auVar30._0_4_;
      auVar22._20_4_ = -auVar30._0_4_;
      auVar22._24_4_ = -auVar30._0_4_;
      auVar22._28_4_ = -auVar30._0_4_;
      uVar23 = auVar28._0_4_;
      uVar26 = auVar28._4_4_;
      auVar25._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
      auVar25._8_4_ = uVar23 ^ 0x80000000;
      auVar25._12_4_ = uVar26 ^ 0x80000000;
      auVar25._16_4_ = uVar23 ^ 0x80000000;
      auVar25._20_4_ = uVar26 ^ 0x80000000;
      auVar25._24_4_ = uVar23 ^ 0x80000000;
      auVar25._28_4_ = uVar26 ^ 0x80000000;
      uVar23 = auVar8._0_4_;
      uVar26 = auVar8._4_4_;
      auVar31._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
      auVar31._8_4_ = uVar23 ^ 0x80000000;
      auVar31._12_4_ = uVar26 ^ 0x80000000;
      auVar31._16_4_ = uVar23 ^ 0x80000000;
      auVar31._20_4_ = uVar26 ^ 0x80000000;
      auVar31._24_4_ = uVar23 ^ 0x80000000;
      auVar31._28_4_ = uVar26 ^ 0x80000000;
      uVar10 = auVar3._0_4_;
      auVar32._4_4_ = uVar10;
      auVar32._0_4_ = uVar10;
      auVar32._8_4_ = uVar10;
      auVar32._12_4_ = uVar10;
      auVar32._16_4_ = uVar10;
      auVar32._20_4_ = uVar10;
      auVar32._24_4_ = uVar10;
      auVar32._28_4_ = uVar10;
      auVar33._4_4_ = fVar1;
      auVar33._0_4_ = fVar1;
      auVar33._8_4_ = fVar1;
      auVar33._12_4_ = fVar1;
      auVar33._16_4_ = fVar1;
      auVar33._20_4_ = fVar1;
      auVar33._24_4_ = fVar1;
      auVar33._28_4_ = fVar1;
      do {
        if (pNVar13 == stack) {
          return;
        }
        sVar18 = pNVar13[-1].ptr;
        pNVar13 = pNVar13 + -1;
        do {
          if ((sVar18 & 8) == 0) {
            auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar18 + 0x40 + uVar14),auVar22,auVar34
                                     );
            auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar18 + 0x40 + uVar15),auVar25,auVar35)
            ;
            auVar4 = vpmaxsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar3));
            auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar18 + 0x40 + uVar16),auVar31,auVar36
                                     );
            auVar5 = vpmaxsd_avx2(ZEXT1632(auVar24),auVar32);
            auVar4 = vpmaxsd_avx2(auVar4,auVar5);
            auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar18 + 0x40 + (uVar14 ^ 0x20)),
                                      auVar22,auVar34);
            auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar18 + 0x40 + (uVar15 ^ 0x20)),auVar25
                                     ,auVar35);
            auVar5 = vpminsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar3));
            auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar18 + 0x40 + (uVar16 ^ 0x20)),
                                      auVar31,auVar36);
            auVar6 = vpminsd_avx2(ZEXT1632(auVar24),auVar33);
            auVar5 = vpminsd_avx2(auVar5,auVar6);
            auVar4 = vpcmpgtd_avx2(auVar4,auVar5);
            uVar10 = vmovmskps_avx(auVar4);
            unaff_R13 = (ulong)(byte)~(byte)uVar10;
          }
          if ((sVar18 & 8) == 0) {
            if (unaff_R13 == 0) {
              iVar19 = 4;
            }
            else {
              uVar17 = sVar18 & 0xfffffffffffffff0;
              lVar12 = 0;
              for (uVar11 = unaff_R13; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000)
              {
                lVar12 = lVar12 + 1;
              }
              iVar19 = 0;
              for (uVar11 = unaff_R13 - 1 & unaff_R13; sVar18 = *(size_t *)(uVar17 + lVar12 * 8),
                  uVar11 != 0; uVar11 = uVar11 - 1 & uVar11) {
                pNVar13->ptr = sVar18;
                pNVar13 = pNVar13 + 1;
                lVar12 = 0;
                for (uVar7 = uVar11; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                  lVar12 = lVar12 + 1;
                }
              }
            }
          }
          else {
            iVar19 = 6;
          }
        } while (iVar19 == 0);
        if (iVar19 == 6) {
          uVar11 = (ulong)((uint)sVar18 & 0xf);
          iVar19 = 0;
          bVar20 = uVar11 != 8;
          if (bVar20) {
            prim = (Primitive *)(sVar18 & 0xfffffffffffffff0);
            bVar9 = InstanceArrayIntersector1::occluded(&pre,ray,context,prim);
            if (!bVar9) {
              uVar17 = 0;
              do {
                prim = prim + 1;
                if (uVar11 - 9 == uVar17) goto LAB_0053322d;
                bVar20 = InstanceArrayIntersector1::occluded(&pre,ray,context,prim);
                uVar17 = uVar17 + 1;
              } while (!bVar20);
              bVar20 = uVar17 < uVar11 - 8;
            }
            iVar19 = 0;
            if (bVar20) {
              ray->tfar = -INFINITY;
              iVar19 = 3;
            }
          }
        }
LAB_0053322d:
      } while (iVar19 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }